

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O0

ClauseIterator __thiscall
Inferences::PrimitiveInstantiation::generateClauses(PrimitiveInstantiation *this,Clause *premise)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Clause *in_RDX;
  long in_RSI;
  IteratorCore<Kernel::Clause_*> *in_RDI;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  it4;
  FlatMapIter<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65)>_>,_Inferences::PrimitiveInstantiation::IsInstantiable>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn>
  it3;
  FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
  it2;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  it1;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Clause *in_stack_fffffffffffffdf0;
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  *in_stack_fffffffffffffe40;
  ResultFn in_stack_fffffffffffffe48;
  ResultFn local_190 [20];
  ApplicableRewritesFn local_f0 [15];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  Clause *local_18;
  
  local_18 = in_RDX;
  Kernel::Clause::getSelectedLiteralIterator(in_stack_fffffffffffffdf0);
  local_68 = local_20;
  local_78 = local_30;
  uVar1 = local_78;
  uStack_70 = uStack_28;
  uVar2 = uStack_70;
  local_78._0_4_ = (undefined4)local_30;
  local_78._4_4_ = (undefined4)((ulong)local_30 >> 0x20);
  uStack_70._0_4_ = (undefined4)uStack_28;
  uStack_70._4_4_ = (undefined4)((ulong)uStack_28 >> 0x20);
  uVar3 = (undefined4)local_78;
  uVar4 = local_78._4_4_;
  uVar5 = (undefined4)uStack_70;
  uVar6 = uStack_70._4_4_;
  local_78 = uVar1;
  uStack_70 = uVar2;
  Lib::
  getFilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::PrimitiveInstantiation::IsInstantiable>
            ();
  Lib::
  FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
  ::FilteredIterator((FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
                      *)CONCAT44(uVar6,uVar5),
                     (FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
                      *)CONCAT44(uVar4,uVar3));
  ApplicableRewritesFn::ApplicableRewritesFn
            (local_f0,*(PrimitiveInstantiationIndex **)(in_RSI + 0x10));
  Lib::
  getMapAndFlattenIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::PrimitiveInstantiation::IsInstantiable,false>,Inferences::PrimitiveInstantiation::ApplicableRewritesFn>
            ((FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
              *)in_stack_fffffffffffffe40,(ApplicableRewritesFn)in_stack_fffffffffffffe48._cl);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
              *)CONCAT44(uVar6,uVar5),
             (FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
              *)CONCAT44(uVar4,uVar3));
  ResultFn::ResultFn(local_190,local_18);
  Lib::
  getMappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::PrimitiveInstantiation::IsInstantiable,false>,Inferences::PrimitiveInstantiation::ApplicableRewritesFn,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermWithoutValue>>>>,Inferences::PrimitiveInstantiation::ResultFn>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe48);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
              *)0x82560d);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  ::MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
                     *)CONCAT44(uVar6,uVar5),
                    (MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
                     *)CONCAT44(uVar4,uVar3));
  Lib::
  pvi<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::PrimitiveInstantiation::IsInstantiable,false>,Inferences::PrimitiveInstantiation::ApplicableRewritesFn,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermWithoutValue>>>>,Inferences::PrimitiveInstantiation::ResultFn,Kernel::Clause*>>
            ((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
              *)in_stack_fffffffffffffe48._cl);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  ::~MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
                      *)0x82563c);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  ::~MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
                      *)0x825649);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
              *)0x825656);
  return (ClauseIterator)in_RDI;
}

Assistant:

ClauseIterator PrimitiveInstantiation::generateClauses(Clause* premise)
{
  //is this correct?
  auto it1 = premise->getSelectedLiteralIterator();
  //filter out literals that are not suitable for narrowing
  auto it2 = getFilteredIterator(it1, IsInstantiable());

  //pair of literals and possible rewrites that can be applied to literals
  auto it3 = getMapAndFlattenIterator(it2, ApplicableRewritesFn(_index));
  
  //apply rewrite rules to literals
  auto it4 = getMappingIterator(it3, ResultFn(premise));
  

  return pvi( it4 );

}